

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::ParsedScene::MakeNamedMedium
          (ParsedScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  Float startTime;
  FileLoc loc_00;
  bool bVar1;
  iterator iVar2;
  mapped_type *this_00;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  ParameterDictionary local_7e8;
  ParameterDictionary dict;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_718;
  Transform local_6b8;
  TransformedSceneEntity local_638;
  AnimatedTransform renderFromMedium;
  
  if (this->currentApiState == Uninitialized) {
    Error<char_const(&)[16]>
              ((FileLoc *)&params,"pbrtInit() must be before calling \"%s()\". Ignoring.",
               (char (*) [16])"MakeNamedMedium");
  }
  else {
    bVar1 = TransformSet::IsAnimated(&this->curTransform);
    if (bVar1) {
      Warning<char_const(&)[16]>
                ((FileLoc *)&params,
                 "Animated transformations set; ignoring for \"%s\" and using the start transform only"
                 ,(char (*) [16])"MakeNamedMedium");
    }
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::InlinedVector(&local_718,in_RDX);
    ParameterDictionary::ParameterDictionary
              (&dict,&local_718,&this->graphicsState->mediumAttributes,
               this->graphicsState->colorSpace);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&local_718);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
            ::find(&(this->media)._M_t,name);
    if ((_Rb_tree_header *)iVar2._M_node == &(this->media)._M_t._M_impl.super__Rb_tree_header) {
      GetCTM((Transform *)&local_638,this,0);
      startTime = this->transformStartTime;
      GetCTM(&local_6b8,this,1);
      AnimatedTransform::AnimatedTransform
                (&renderFromMedium,(Transform *)&local_638,startTime,&local_6b8,
                 this->transformEndTime);
      ParameterDictionary::ParameterDictionary(&local_7e8,&dict);
      loc_00.filename._M_str = (char *)params.ptr;
      loc_00.filename._M_len = (size_t)params.alloc.memoryResource;
      loc_00._16_8_ = params.field_2.fixed[0];
      TransformedSceneEntity::TransformedSceneEntity
                (&local_638,name,&local_7e8,loc_00,&renderFromMedium);
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
                ::operator[](&this->media,name);
      TransformedSceneEntity::operator=(this_00,&local_638);
      SceneEntity::~SceneEntity(&local_638.super_SceneEntity);
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::~InlinedVector(&local_7e8.params);
    }
    else {
      (this->super_SceneRepresentation).errorExit = true;
      Error<std::__cxx11::string_const&>((FileLoc *)&params,"Named medium \"%s\" redefined.",name);
    }
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&dict.params);
  }
  return;
}

Assistant:

void ParsedScene::MakeNamedMedium(const std::string &name, ParsedParameterVector params,
                                  FileLoc loc) {
    VERIFY_INITIALIZED("MakeNamedMedium");
    WARN_IF_ANIMATED_TRANSFORM("MakeNamedMedium");
    ParameterDictionary dict(std::move(params), graphicsState->mediumAttributes,
                             graphicsState->colorSpace);

    if (media.find(name) != media.end()) {
        ErrorExitDeferred(&loc, "Named medium \"%s\" redefined.", name);
        return;
    }

    AnimatedTransform renderFromMedium(GetCTM(0), transformStartTime, GetCTM(1),
                                       transformEndTime);

    media[name] = TransformedSceneEntity(name, std::move(dict), loc, renderFromMedium);
}